

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O3

void FAudio_OPERATIONSET_QueueSetFrequencyRatio
               (FAudioSourceVoice *voice,float Ratio,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  FAudio_OPERATIONSET_Operation *pFVar2;
  FAudio_OPERATIONSET_Operation **ppFVar3;
  FAudio_OPERATIONSET_Operation *pFVar4;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar2 = (FAudio_OPERATIONSET_Operation *)(*voice->audio->pMalloc)(0x30);
  pFVar2->Type = FAUDIOOP_SETFREQUENCYRATIO;
  pFVar2->Voice = voice;
  pFVar2->OperationSet = OperationSet;
  pFVar2->next = (FAudio_OPERATIONSET_Operation *)0x0;
  pFVar1 = voice->audio->queuedOperations;
  if (pFVar1 == (FAudio_OPERATIONSET_Operation *)0x0) {
    ppFVar3 = &voice->audio->queuedOperations;
  }
  else {
    do {
      pFVar4 = pFVar1;
      pFVar1 = pFVar4->next;
    } while (pFVar1 != (FAudio_OPERATIONSET_Operation *)0x0);
    ppFVar3 = &pFVar4->next;
  }
  *ppFVar3 = pFVar2;
  (pFVar2->Data).EnableEffect.EffectIndex = (uint32_t)Ratio;
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetFrequencyRatio(
	FAudioSourceVoice *voice,
	float Ratio,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETFREQUENCYRATIO,
		OperationSet
	);

	op->Data.SetFrequencyRatio.Ratio = Ratio;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}